

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void * qemu_ram_ptr_length(uc_struct_conflict15 *uc,RAMBlock *ram_block,ram_addr_t addr,hwaddr *size
                          ,_Bool lock)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  uVar1 = *size;
  if (uVar1 == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    if (ram_block == (RAMBlock *)0x0) {
      ram_block = qemu_get_ram_block(uc,addr);
      addr = addr - ram_block->offset;
      uVar1 = *size;
    }
    uVar3 = ram_block->max_length - addr;
    if (uVar1 < uVar3) {
      uVar3 = uVar1;
    }
    *size = uVar3;
    if ((ram_block->host == (uint8_t *)0x0) || (ram_block->used_length <= addr)) {
      __assert_fail("offset_in_ramblock(block, offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/exec/ram_addr.h"
                    ,0x22,"void *ramblock_ptr(RAMBlock *, ram_addr_t)");
    }
    puVar2 = ram_block->host + addr;
  }
  return puVar2;
}

Assistant:

static void *qemu_ram_ptr_length(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr,
                                 hwaddr *size, bool lock)
{
    RAMBlock *block = ram_block;
    if (*size == 0) {
        return NULL;
    }

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }
    *size = MIN(*size, block->max_length - addr);

    return ramblock_ptr(block, addr);
}